

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glw_json.h
# Opt level: O2

bool json::save<one_int_var>(ostream *out,one_int_var *t,int tabs)

{
  int iVar1;
  SaveObject serializer;
  
  std::operator<<(out,"{\n");
  serializer.tabs = tabs + 1;
  serializer.first = true;
  serializer.out = out;
  serialize<json::SaveObject>(&serializer,t);
  std::operator<<(out,"\n");
  iVar1 = 0;
  if (0 < tabs) {
    iVar1 = tabs;
  }
  while (iVar1 != 0) {
    std::operator<<(out,'\t');
    iVar1 = iVar1 + -1;
  }
  std::operator<<(out,'}');
  return ((byte)out[*(long *)(*(long *)out + -0x18) + 0x20] & 5) == 0;
}

Assistant:

bool save(std::ostream& out, T& t, int tabs) {
	out << "{\n";
	SaveObject serializer(out, tabs + 1);
	serialize(serializer, t); // serialize should be defined for type T
	out << "\n";
	for (int i = 0; i < tabs; ++i) out << '\t';
	out << '}';
	return !out.fail();
}